

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O2

void GetProjectCommands(cmState *state)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_compile_definitions",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddCompileDefinitionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_custom_command",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddCustomCommandCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_custom_target",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddCustomTargetCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_definitions",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddDefinitionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_dependencies",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddDependenciesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"add_executable",&local_29)
  ;
  cmState::AddBuiltinCommand(state,&local_28,cmAddExecutableCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"add_library",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddLibraryCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_subdirectory",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddSubDirectoryCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"add_test",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddTestCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"build_command",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmBuildCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"create_test_sourcelist",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmCreateTestSourceList);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"define_property",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmDefinePropertyCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"enable_language",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmEnableLanguageCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"enable_testing",&local_29)
  ;
  cmState::AddBuiltinCommand(state,&local_28,cmEnableTestingCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"get_source_file_property",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmGetSourceFilePropertyCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"get_target_property",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmGetTargetPropertyCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"get_test_property",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmGetTestPropertyCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"include_directories",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmIncludeDirectoryCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"include_regular_expression",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmIncludeRegularExpressionCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"install",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmInstallCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"install_files",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmInstallFilesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"install_targets",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmInstallTargetsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"link_directories",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmLinkDirectoriesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"project",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmProjectCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"set_source_files_properties",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmSetSourceFilesPropertiesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"set_target_properties",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmSetTargetPropertiesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"set_tests_properties",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmSetTestsPropertiesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"subdirs",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmSubdirCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_compile_definitions",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetCompileDefinitionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_compile_features",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetCompileFeaturesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_compile_options",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetCompileOptionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_include_directories",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetIncludeDirectoriesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_link_libraries",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetLinkLibrariesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_link_options",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetLinkOptionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"target_sources",&local_29)
  ;
  cmState::AddBuiltinCommand(state,&local_28,cmTargetSourcesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"try_compile",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTryCompileCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"try_run",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTryRunCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_precompile_headers",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetPrecompileHeadersCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_compile_options",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddCompileOptionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"aux_source_directory",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAuxSourceDirectoryCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"export",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmExportCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"fltk_wrap_ui",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmFLTKWrapUICommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"include_external_msproject",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmIncludeExternalMSProjectCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"install_programs",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmInstallProgramsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_link_options",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmAddLinkOptionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"link_libraries",&local_29)
  ;
  cmState::AddBuiltinCommand(state,&local_28,cmLinkLibrariesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_link_directories",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmTargetLinkDirectoriesCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"qt_wrap_cpp",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmQTWrapCPPCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"qt_wrap_ui",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmQTWrapUICommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"remove_definitions",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmRemoveDefinitionsCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"source_group",&local_29);
  cmState::AddBuiltinCommand(state,&local_28,cmSourceGroupCommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"cmake_file_api",&local_29)
  ;
  cmState::AddBuiltinCommand(state,&local_28,cmFileAPICommand);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"export_library_dependencies",&local_29);
  cmState::AddDisallowedCommand
            (state,&local_28,cmExportLibraryDependenciesCommand,CMP0033,
             "The export_library_dependencies command should not be called; see CMP0033.",
             (char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"load_command",&local_29);
  cmState::AddDisallowedCommand
            (state,&local_28,cmLoadCommandCommand,CMP0031,
             "The load_command command should not be called; see CMP0031.",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"output_required_files",&local_29);
  cmState::AddDisallowedCommand
            (state,&local_28,cmOutputRequiredFilesCommand,CMP0032,
             "The output_required_files command should not be called; see CMP0032.",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"subdir_depends",&local_29)
  ;
  cmState::AddDisallowedCommand
            (state,&local_28,cmSubdirDependsCommand,CMP0029,
             "The subdir_depends command should not be called; see CMP0029.",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"utility_source",&local_29)
  ;
  cmState::AddDisallowedCommand
            (state,&local_28,cmUtilitySourceCommand,CMP0034,
             "The utility_source command should not be called; see CMP0034.",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"variable_requires",&local_29);
  cmState::AddDisallowedCommand
            (state,&local_28,cmVariableRequiresCommand,CMP0035,
             "The variable_requires command should not be called; see CMP0035.",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void GetProjectCommands(cmState* state)
{
  state->AddBuiltinCommand("add_compile_definitions",
                           cmAddCompileDefinitionsCommand);
  state->AddBuiltinCommand("add_custom_command", cmAddCustomCommandCommand);
  state->AddBuiltinCommand("add_custom_target", cmAddCustomTargetCommand);
  state->AddBuiltinCommand("add_definitions", cmAddDefinitionsCommand);
  state->AddBuiltinCommand("add_dependencies", cmAddDependenciesCommand);
  state->AddBuiltinCommand("add_executable", cmAddExecutableCommand);
  state->AddBuiltinCommand("add_library", cmAddLibraryCommand);
  state->AddBuiltinCommand("add_subdirectory", cmAddSubDirectoryCommand);
  state->AddBuiltinCommand("add_test", cmAddTestCommand);
  state->AddBuiltinCommand("build_command", cmBuildCommand);
  state->AddBuiltinCommand("create_test_sourcelist", cmCreateTestSourceList);
  state->AddBuiltinCommand("define_property", cmDefinePropertyCommand);
  state->AddBuiltinCommand("enable_language", cmEnableLanguageCommand);
  state->AddBuiltinCommand("enable_testing", cmEnableTestingCommand);
  state->AddBuiltinCommand("get_source_file_property",
                           cmGetSourceFilePropertyCommand);
  state->AddBuiltinCommand("get_target_property", cmGetTargetPropertyCommand);
  state->AddBuiltinCommand("get_test_property", cmGetTestPropertyCommand);
  state->AddBuiltinCommand("include_directories", cmIncludeDirectoryCommand);
  state->AddBuiltinCommand("include_regular_expression",
                           cmIncludeRegularExpressionCommand);
  state->AddBuiltinCommand("install", cmInstallCommand);
  state->AddBuiltinCommand("install_files", cmInstallFilesCommand);
  state->AddBuiltinCommand("install_targets", cmInstallTargetsCommand);
  state->AddBuiltinCommand("link_directories", cmLinkDirectoriesCommand);
  state->AddBuiltinCommand("project", cmProjectCommand);
  state->AddBuiltinCommand("set_source_files_properties",
                           cmSetSourceFilesPropertiesCommand);
  state->AddBuiltinCommand("set_target_properties",
                           cmSetTargetPropertiesCommand);
  state->AddBuiltinCommand("set_tests_properties",
                           cmSetTestsPropertiesCommand);
  state->AddBuiltinCommand("subdirs", cmSubdirCommand);
  state->AddBuiltinCommand("target_compile_definitions",
                           cmTargetCompileDefinitionsCommand);
  state->AddBuiltinCommand("target_compile_features",
                           cmTargetCompileFeaturesCommand);
  state->AddBuiltinCommand("target_compile_options",
                           cmTargetCompileOptionsCommand);
  state->AddBuiltinCommand("target_include_directories",
                           cmTargetIncludeDirectoriesCommand);
  state->AddBuiltinCommand("target_link_libraries",
                           cmTargetLinkLibrariesCommand);
  state->AddBuiltinCommand("target_link_options", cmTargetLinkOptionsCommand);
  state->AddBuiltinCommand("target_sources", cmTargetSourcesCommand);
  state->AddBuiltinCommand("try_compile", cmTryCompileCommand);
  state->AddBuiltinCommand("try_run", cmTryRunCommand);
  state->AddBuiltinCommand("target_precompile_headers",
                           cmTargetPrecompileHeadersCommand);

#if !defined(CMAKE_BOOTSTRAP)
  state->AddBuiltinCommand("add_compile_options", cmAddCompileOptionsCommand);
  state->AddBuiltinCommand("aux_source_directory",
                           cmAuxSourceDirectoryCommand);
  state->AddBuiltinCommand("export", cmExportCommand);
  state->AddBuiltinCommand("fltk_wrap_ui", cmFLTKWrapUICommand);
  state->AddBuiltinCommand("include_external_msproject",
                           cmIncludeExternalMSProjectCommand);
  state->AddBuiltinCommand("install_programs", cmInstallProgramsCommand);
  state->AddBuiltinCommand("add_link_options", cmAddLinkOptionsCommand);
  state->AddBuiltinCommand("link_libraries", cmLinkLibrariesCommand);
  state->AddBuiltinCommand("target_link_directories",
                           cmTargetLinkDirectoriesCommand);
  state->AddBuiltinCommand("qt_wrap_cpp", cmQTWrapCPPCommand);
  state->AddBuiltinCommand("qt_wrap_ui", cmQTWrapUICommand);
  state->AddBuiltinCommand("remove_definitions", cmRemoveDefinitionsCommand);
  state->AddBuiltinCommand("source_group", cmSourceGroupCommand);
  state->AddBuiltinCommand("cmake_file_api", cmFileAPICommand);

  state->AddDisallowedCommand(
    "export_library_dependencies", cmExportLibraryDependenciesCommand,
    cmPolicies::CMP0033,
    "The export_library_dependencies command should not be called; "
    "see CMP0033.");
  state->AddDisallowedCommand(
    "load_command", cmLoadCommandCommand, cmPolicies::CMP0031,
    "The load_command command should not be called; see CMP0031.");
  state->AddDisallowedCommand(
    "output_required_files", cmOutputRequiredFilesCommand, cmPolicies::CMP0032,
    "The output_required_files command should not be called; see CMP0032.");
  state->AddDisallowedCommand(
    "subdir_depends", cmSubdirDependsCommand, cmPolicies::CMP0029,
    "The subdir_depends command should not be called; see CMP0029.");
  state->AddDisallowedCommand(
    "utility_source", cmUtilitySourceCommand, cmPolicies::CMP0034,
    "The utility_source command should not be called; see CMP0034.");
  state->AddDisallowedCommand(
    "variable_requires", cmVariableRequiresCommand, cmPolicies::CMP0035,
    "The variable_requires command should not be called; see CMP0035.");
#endif
}